

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O3

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_GetLocaleData
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  JavascriptLibrary *this;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint32 length;
  BOOL BVar4;
  charcount_t cVar5;
  undefined4 *puVar6;
  JavascriptString *pJVar7;
  LPCSTR pCVar8;
  size_t sVar9;
  JavascriptString *pJVar10;
  long lVar11;
  size_t sVar12;
  Recycler *pRVar13;
  ulong uVar14;
  JavascriptString *pJVar15;
  JavascriptArray *pJVar16;
  ulong uVar17;
  char *pcVar18;
  char *error;
  uint uVar19;
  uint lineNumber;
  size_t size;
  char16 *pcVar20;
  Type *pTVar21;
  size_t sVar22;
  uint in_stack_00000010;
  ulong in_stack_00000020;
  Var in_stack_00000028;
  char local_138 [8];
  char localeID [157];
  TrackAllocData data;
  ulong local_60;
  int local_54;
  ScopedICUObject<UNumberingSystem_*,_&unumsys_close_70> SStack_50;
  int collationLen;
  ScopedUEnumeration collations;
  JavascriptArray *local_40;
  int local_34 [2];
  UErrorCode status;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  uVar19 = callInfo._0_4_;
  if (in_stack_00000010 != uVar19) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,1099,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00b575c5;
    *puVar6 = 0;
  }
  if ((uVar19 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,1099,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) goto LAB_00b575c5;
    *puVar6 = 0;
  }
  data._32_8_ = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr;
  if ((uVar19 & 0xffffff) == 3) {
    if (in_stack_00000020 >> 0x32 == 0) {
      if ((in_stack_00000020 & 0x1ffff00000000) == 0x1000000000000 ||
          (in_stack_00000020 & 0xffff000000000000) != 0x1000000000000) {
        if ((in_stack_00000020 & 0xffff000000000000) != 0x1000000000000) goto LAB_00b56180;
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) goto LAB_00b575c5;
        *puVar6 = 0;
      }
    }
    bVar2 = VarIs<Js::JavascriptString>(in_stack_00000028);
    if (!bVar2) goto LAB_00b56180;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,1099,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar2) goto LAB_00b575c5;
      *puVar6 = 0;
    }
LAB_00b56180:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x450,
                                "((args.Info.Count == 3 && (JavascriptNumber::Is(args.Values[1]) || TaggedInt::Is(args.Values[1])) && VarIs<JavascriptString>(args.Values[2])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar2) goto LAB_00b575c5;
    *puVar6 = 0;
  }
  if ((in_stack_00000020 & 0x1ffff00000000) == 0x1000000000000 ||
      (in_stack_00000020 & 0xffff000000000000) != 0x1000000000000) {
    if ((in_stack_00000020 & 0xffff000000000000) == 0x1000000000000) goto LAB_00b56267;
    if (in_stack_00000020 >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar2) goto LAB_00b575c5;
      *puVar6 = 0;
    }
    in_stack_00000020 = (ulong)(uint)(int)(double)(in_stack_00000020 ^ 0xfffc000000000000);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b575c5;
    *puVar6 = 0;
LAB_00b56267:
    if (((in_stack_00000020 & 0x1ffff00000000) == 0x1000000000000) ||
       ((in_stack_00000020 & 0xffff000000000000) != 0x1000000000000)) {
      if ((in_stack_00000020 & 0xffff000000000000) == 0x1000000000000) goto LAB_00b5638a;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      error = "(Is(aValue))";
      pcVar18 = "Ensure var is actually a \'TaggedInt\'";
      lineNumber = 0x43;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar18 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      lineNumber = 0x2a;
    }
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,lineNumber,error,pcVar18);
    if (!bVar2) goto LAB_00b575c5;
    *puVar6 = 0;
  }
LAB_00b5638a:
  local_34[0] = 0;
  memset((char (*) [157])local_138,0,0x9d);
  pJVar7 = UnsafeVarTo<Js::JavascriptString>(in_stack_00000028);
  LangtagToLocaleID<157ul>(pJVar7,(char (*) [157])local_138);
  if (5 < (uint)in_stack_00000020) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x523,"(false)","GetLocaleData called with unknown kind parameter")
    ;
    if (bVar2) {
      *puVar6 = 0;
      return (JavascriptArray *)0x0;
    }
    goto LAB_00b575c5;
  }
  this = *(JavascriptLibrary **)(data._32_8_ + 8);
  switch(in_stack_00000020 & 0xffffffff) {
  case 1:
    register0x00000000 = (undefined **)ucol_open_70(local_138,local_34);
    iVar3 = ucol_getAttribute_70(register0x00000000,2,local_34);
    if (local_34[0] == 7) {
      Throw::OutOfMemory();
    }
    if (0 < local_34[0] || local_34[0] == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      pCVar8 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x497,"(false)",pCVar8);
      if (!bVar2) goto LAB_00b575c5;
      *puVar6 = 0;
    }
    local_40 = JavascriptLibrary::CreateArray(this,3);
    pTVar21 = &this->stringCache;
    pJVar7 = StringCache::GetFalseDisplay(pTVar21);
    pJVar15 = StringCache::GetIntlCaseFirstUpper(pTVar21);
    pJVar10 = StringCache::GetIntlCaseFirstLower(pTVar21);
    if (iVar3 == 0x19) {
      (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (local_40,0,pJVar15,0);
LAB_00b57575:
      (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (local_40,1,pJVar10,0);
    }
    else {
      if (iVar3 == 0x18) {
        (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (local_40,0,pJVar10,0);
        pJVar10 = pJVar15;
        goto LAB_00b57575;
      }
      if (iVar3 != 0x10) goto LAB_00b575a3;
      (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (local_40,0,pJVar7,0);
      (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (local_40,1,pJVar15,0);
      pJVar7 = pJVar10;
    }
    (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (local_40,2,pJVar7,0);
LAB_00b575a3:
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UCollator_*,_&ucol_close_70>::~ScopedICUObject
              ((ScopedICUObject<UCollator_*,_&ucol_close_70> *)(localeID + 0x98));
    return local_40;
  case 2:
    register0x00000000 = (undefined **)ucol_open_70(local_138,local_34);
    iVar3 = ucol_getAttribute_70(register0x00000000,7,local_34);
    if (local_34[0] == 7) {
      Throw::OutOfMemory();
    }
    if (0 < local_34[0] || local_34[0] == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      pCVar8 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x4b5,"(false)",pCVar8);
      if (!bVar2) goto LAB_00b575c5;
      *puVar6 = 0;
    }
    local_40 = JavascriptLibrary::CreateArray(this,2);
    pJVar7 = StringCache::GetFalseDisplay(&this->stringCache);
    pJVar10 = StringCache::GetTrueDisplay(&this->stringCache);
    if (iVar3 == 0x11) {
      (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (local_40,0,pJVar10,0);
    }
    else {
      if (iVar3 != 0x10) goto LAB_00b575a3;
      (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (local_40,0,pJVar7,0);
      pJVar7 = pJVar10;
    }
    (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (local_40,1,pJVar7,0);
    goto LAB_00b575a3;
  case 3:
    SStack_50.object =
         (UNumberingSystem *)ucal_getKeywordValuesForLocale_70("calendar",local_138,0,local_34);
    length = uenum_count_70(SStack_50.object,local_34);
    local_40 = JavascriptLibrary::CreateArray(this,length);
    if (local_34[0] == 7) {
      Throw::OutOfMemory();
    }
    if (0 < local_34[0] || local_34[0] == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      pCVar8 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x4ca,"(false)",pCVar8);
      if (!bVar2) goto LAB_00b575c5;
      *puVar6 = 0;
    }
    local_54 = 0;
    lVar11 = uenum_next_70(SStack_50.object,&local_54,local_34);
    if (lVar11 != 0) {
      local_60 = 0;
      collations.object = (UEnumeration *)__tls_get_addr(&PTR_01548f08);
      do {
        if (local_34[0] == 7) {
          Throw::OutOfMemory();
        }
        if (local_34[0] < 1 && local_34[0] != -0x7c) {
          if (local_54 < 1) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)collations.object = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                        ,0x4d1,"(calendar != nullptr && calendarLen > 0)",
                                        "calendar != nullptr && calendarLen > 0");
            goto LAB_00b56af2;
          }
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)collations.object = 1;
          pCVar8 = (LPCSTR)u_errorName_70(local_34[0]);
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x4d1,"(false)",pCVar8);
LAB_00b56af2:
          if (bVar2 == false) goto LAB_00b575c5;
          *(undefined4 *)collations.object = 0;
        }
        pcVar18 = (char *)uloc_toUnicodeLocaleType_70("calendar",lVar11);
        if (pcVar18 == (char *)0x0) {
          Throw::OutOfMemory();
        }
        sVar9 = strlen(pcVar18);
        pRVar13 = *(Recycler **)(data._32_8_ + 0x1200);
        sVar12 = strlen(pcVar18);
        data.plusSize = sVar12 + 1;
        stack0xffffffffffffff68 = &char16_t::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.count = (size_t)anon_var_dwarf_66fc5bd;
        data.filename._0_4_ = 0x4d8;
        pRVar13 = Memory::Recycler::TrackAllocInfo(pRVar13,(TrackAllocData *)(localeID + 0x98));
        sVar12 = strlen(pcVar18);
        lVar11 = sVar12 + 1;
        if (lVar11 == 0) {
          Memory::Recycler::ClearTrackAllocInfo(pRVar13,(TrackAllocData *)0x0);
          pcVar20 = (char16 *)&DAT_00000008;
LAB_00b56c17:
          if (0xfffffffe < sVar9) {
LAB_00b56c21:
            *pcVar20 = L'\0';
            uVar19 = 0;
            goto LAB_00b56d94;
          }
          if (sVar9 == 0) {
            lVar11 = 0;
LAB_00b56cbf:
            if (sVar9 - lVar11 == 0) goto LAB_00b56cc7;
            cVar5 = utf8::ByteIndexIntoCharacterIndex
                              ((LPCUTF8)(pcVar18 + lVar11),sVar9 - lVar11,doDefault);
            sVar12 = (size_t)(cVar5 + (int)lVar11);
            uVar19 = 0;
            if (sVar9 < sVar12) goto LAB_00b56d94;
            utf8::DecodeUnitsIntoAndNullTerminateNoAdvance
                      (pcVar20 + lVar11,(LPCUTF8)(pcVar18 + lVar11),(LPCUTF8)(pcVar18 + sVar9),
                       doAllowInvalidWCHARs,(bool *)0x0);
            if (pcVar20[sVar12] != L'\0') {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *(undefined4 *)collations.object = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                                          ,0xaa,"(destString[*destCount] == 0)",
                                          "destString[*destCount] == 0");
              if (!bVar2) goto LAB_00b575c5;
              *(undefined4 *)collations.object = 0;
            }
          }
          else {
            uVar14 = 0;
            do {
              if (pcVar18[uVar14] < '\x01') {
                lVar11 = 0;
                if (2 < uVar14) {
                  lVar11 = uVar14 - 3;
                }
                goto LAB_00b56cbf;
              }
              pcVar20[uVar14] = (short)pcVar18[uVar14];
              uVar14 = uVar14 + 1;
            } while (sVar9 != uVar14);
LAB_00b56cc7:
            pcVar20[sVar9] = L'\0';
            sVar12 = sVar9 & 0xffffffff;
          }
          uVar19 = (uint)sVar12;
          if (0x7ffffffd < uVar19 || sVar9 != sVar12) goto LAB_00b56d94;
        }
        else {
          sVar22 = lVar11 * 2;
          if (lVar11 < 0) {
            sVar22 = 0xffffffffffffffff;
          }
          BVar4 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar4 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)collations.object = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                        "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar2) goto LAB_00b575c5;
            *(undefined4 *)collations.object = 0;
          }
          pcVar20 = (char16 *)
                    Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                              (pRVar13,sVar22);
          if (pcVar20 != (char16 *)0x0) goto LAB_00b56c17;
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)collations.object = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar2) goto LAB_00b575c5;
          *(undefined4 *)collations.object = 0;
          if (0xfffffffe < sVar9) goto LAB_00b56c21;
          uVar19 = 0;
          pcVar20 = (char16 *)0x0;
LAB_00b56d94:
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)collations.object = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x4e4,
                                      "(hr == ((HRESULT)0x00000000L) && unicodeCalendar16Len == unicodeCalendarLen && unicodeCalendar16Len < MaxCharCount)"
                                      ,"Unicode calendar char16 conversion was unsuccessful");
          if (!bVar2) goto LAB_00b575c5;
          *(undefined4 *)collations.object = 0;
        }
        pJVar7 = JavascriptString::NewWithBuffer(pcVar20,uVar19,(ScriptContext *)data._32_8_);
        (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (local_40,local_60,pJVar7,0);
        lVar11 = uenum_next_70(SStack_50.object,&local_54,local_34);
        local_60 = (ulong)((int)local_60 + 1);
      } while (lVar11 != 0);
    }
    goto LAB_00b56e2a;
  case 4:
    SStack_50.object = (UNumberingSystem *)unumsys_open_70(local_138,local_34);
    if (local_34[0] == 7) {
      Throw::OutOfMemory();
    }
    if (0 < local_34[0] || local_34[0] == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      pCVar8 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x4f5,"(false)",pCVar8);
      if (!bVar2) goto LAB_00b575c5;
      *puVar6 = 0;
    }
    pcVar18 = (char *)unumsys_getName_70(SStack_50.object);
    stack0xffffffffffffff68 = (undefined **)0x0;
    sVar9 = strnlen(pcVar18,0x7fffffff);
    utf8::NarrowStringToWide<void*(*)(unsigned_long)>
              (utf8::malloc_allocator::allocate,pcVar18,sVar9,(LPWSTR *)(localeID + 0x98),
               (charcount_t *)&data,&data.plusSize);
    data.count = CONCAT71(data.count._1_7_,1);
    pJVar16 = JavascriptLibrary::CreateArray(this,0x16);
    pJVar7 = JavascriptString::NewCopySz
                       ((char16 *)stack0xffffffffffffff68,(ScriptContext *)data._32_8_);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,0,pJVar7,0);
    pTVar21 = &this->stringCache;
    pJVar7 = StringCache::GetIntlNumsysArab(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,1,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysArabext(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,2,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysBali(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,3,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysBeng(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,4,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysDeva(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,5,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysFullwide(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,6,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysGujr(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,7,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysGuru(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,8,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysHanidec(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,9,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysKhmr(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,10,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysKnda(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,0xb,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysLaoo(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,0xc,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysLatn(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,0xd,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysLimb(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,0xe,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysMlym(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,0xf,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysMong(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,0x10,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysMymr(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,0x11,pJVar7);
    pJVar7 = StringCache::GetIntlNumsysOrya(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,0x12,pJVar7);
    pJVar7 = StringCache::GetIntlNumsysTamldec(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,0x13,pJVar7);
    pJVar7 = StringCache::GetIntlNumsysTelu(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,0x14,pJVar7,0);
    pJVar7 = StringCache::GetIntlNumsysThai(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,0x15,pJVar7);
    pJVar7 = StringCache::GetIntlNumsysTibt(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,0x16,pJVar7,0);
    if ((stack0xffffffffffffff68 != (undefined **)0x0) && ((char)data.count == '\x01')) {
      free(stack0xffffffffffffff68);
    }
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UNumberingSystem_*,_&unumsys_close_70>::
    ~ScopedICUObject(&stack0xffffffffffffffb0);
    return pJVar16;
  case 5:
    pJVar16 = JavascriptLibrary::CreateArray(this,5);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,0,(this->super_JavascriptLibraryBase).nullValue.ptr,0);
    pTVar21 = &this->stringCache;
    pJVar7 = StringCache::GetIntlHourCycle11(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,1,pJVar7,0);
    pJVar7 = StringCache::GetIntlHourCycle12(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,2,pJVar7,0);
    pJVar7 = StringCache::GetIntlHourCycle23(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,3,pJVar7,0);
    pJVar7 = StringCache::GetIntlHourCycle24(pTVar21);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,4,pJVar7,0);
    return pJVar16;
  }
  SStack_50.object =
       (UNumberingSystem *)ucol_getKeywordValuesForLocale_70("collation",local_138,0,local_34);
  iVar3 = uenum_count_70(SStack_50.object,local_34);
  if (local_34[0] == 7) {
    Throw::OutOfMemory();
  }
  if (local_34[0] < 1 && local_34[0] != -0x7c) {
    if (iVar3 < 3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x466,"(collationsCount > 2)","collationsCount > 2");
      goto LAB_00b570be;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    pCVar8 = (LPCSTR)u_errorName_70(local_34[0]);
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x466,"(false)",pCVar8);
LAB_00b570be:
    if (bVar2 == false) {
LAB_00b575c5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  local_40 = JavascriptLibrary::CreateArray(this,iVar3 - 1);
  (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
    .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
            (local_40,0,(this->super_JavascriptLibraryBase).nullValue.ptr,0);
  local_54 = 0;
  pcVar18 = (char *)uenum_next_70(SStack_50.object,&local_54,local_34);
  uVar14 = 0;
  collations.object = (UEnumeration *)__tls_get_addr(&PTR_01548f08);
  while (pcVar18 != (char *)0x0) {
    if (local_34[0] == 7) {
      Throw::OutOfMemory();
    }
    if (local_34[0] < 1 && local_34[0] != -0x7c) {
      if (local_54 < 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *(undefined4 *)collations.object = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x471,"(collation != nullptr && collationLen > 0)",
                                    "collation != nullptr && collationLen > 0");
        goto LAB_00b571c6;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *(undefined4 *)collations.object = 1;
      pCVar8 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x471,"(false)",pCVar8);
LAB_00b571c6:
      if (bVar2 == false) goto LAB_00b575c5;
      *(undefined4 *)collations.object = 0;
    }
    iVar3 = strcmp(pcVar18,"standard");
    if ((iVar3 != 0) && (iVar3 = strcmp(pcVar18,"search"), iVar3 != 0)) {
      pcVar18 = (char *)uloc_toUnicodeLocaleType_70("collation",pcVar18);
      if (pcVar18 == (char *)0x0) {
        Throw::OutOfMemory();
      }
      sVar9 = strlen(pcVar18);
      sVar22 = sVar9 + 1;
      stack0xffffffffffffff68 = &char16_t::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_66fc5bd;
      data.filename._0_4_ = 0x47d;
      data.plusSize = sVar22;
      pRVar13 = Memory::Recycler::TrackAllocInfo
                          (*(Recycler **)(data._32_8_ + 0x1200),(TrackAllocData *)(localeID + 0x98))
      ;
      if (sVar22 == 0) {
        Memory::Recycler::ClearTrackAllocInfo(pRVar13,(TrackAllocData *)0x0);
        pcVar20 = (char16 *)&DAT_00000008;
LAB_00b57347:
        *pcVar20 = L'\0';
        cVar5 = 0;
LAB_00b5740d:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *(undefined4 *)collations.object = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x489,
                                    "(hr == ((HRESULT)0x00000000L) && unicodeCollation16Len == unicodeCollationLen && unicodeCollation16Len < MaxCharCount)"
                                    ,"Unicode collation char16 conversion was unsuccessful");
        if (!bVar2) goto LAB_00b575c5;
        *(undefined4 *)collations.object = 0;
      }
      else {
        size = sVar22 * 2;
        if ((long)sVar22 < 0) {
          size = 0xffffffffffffffff;
        }
        BVar4 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)collations.object = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                      "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar2) goto LAB_00b575c5;
          *(undefined4 *)collations.object = 0;
        }
        pcVar20 = (char16 *)
                  Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                            (pRVar13,size);
        if (pcVar20 == (char16 *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)collations.object = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (bVar2) {
            *(undefined4 *)collations.object = 0;
            cVar5 = 0;
            pcVar20 = (char16 *)0x0;
            goto LAB_00b5740d;
          }
          goto LAB_00b575c5;
        }
        if (0xfffffffe < sVar9) goto LAB_00b57347;
        if (sVar9 == 0) {
          lVar11 = 0;
LAB_00b573c1:
          if (sVar9 - lVar11 == 0) goto LAB_00b573c9;
          cVar5 = utf8::ByteIndexIntoCharacterIndex
                            ((LPCUTF8)(pcVar18 + lVar11),sVar9 - lVar11,doDefault);
          uVar17 = (ulong)(cVar5 + (int)lVar11);
          cVar5 = 0;
          if (sVar9 < uVar17) goto LAB_00b5740d;
          utf8::DecodeUnitsIntoAndNullTerminateNoAdvance
                    (pcVar20 + lVar11,(LPCUTF8)(pcVar18 + lVar11),(LPCUTF8)(pcVar18 + sVar9),
                     doAllowInvalidWCHARs,(bool *)0x0);
          if (pcVar20[uVar17] != L'\0') {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)collations.object = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                                        ,0xaa,"(destString[*destCount] == 0)",
                                        "destString[*destCount] == 0");
            if (!bVar2) goto LAB_00b575c5;
            *(undefined4 *)collations.object = 0;
          }
        }
        else {
          uVar17 = 0;
          do {
            if (pcVar18[uVar17] < '\x01') {
              lVar11 = 0;
              if (2 < uVar17) {
                lVar11 = uVar17 - 3;
              }
              goto LAB_00b573c1;
            }
            pcVar20[uVar17] = (short)pcVar18[uVar17];
            uVar17 = uVar17 + 1;
          } while (sVar9 != uVar17);
LAB_00b573c9:
          pcVar20[sVar9] = L'\0';
          uVar17 = sVar9 & 0xffffffff;
        }
        cVar5 = (charcount_t)uVar17;
        if (0x7ffffffd < cVar5 || sVar9 != uVar17) goto LAB_00b5740d;
      }
      pJVar7 = JavascriptString::NewWithBuffer(pcVar20,cVar5,(ScriptContext *)data._32_8_);
      uVar14 = (ulong)((int)uVar14 + 1);
      (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (local_40,uVar14,pJVar7,0);
    }
    pcVar18 = (char *)uenum_next_70(SStack_50.object,&local_54,local_34);
  }
LAB_00b56e2a:
  PlatformAgnostic::ICUHelpers::ScopedICUObject<UEnumeration_*,_&uenum_close_70>::~ScopedICUObject
            ((ScopedICUObject<UEnumeration_*,_&uenum_close_70> *)&stack0xffffffffffffffb0);
  return local_40;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_GetLocaleData(RecyclableObject* function, CallInfo callInfo, ...)
    {
#ifdef INTL_ICU
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(
            args.Info.Count == 3 &&
            (JavascriptNumber::Is(args.Values[1]) || TaggedInt::Is(args.Values[1])) &&
            VarIs<JavascriptString>(args.Values[2])
        );

        LocaleDataKind kind = (LocaleDataKind) (TaggedInt::Is(args.Values[1])
            ? TaggedInt::ToInt32(args.Values[1])
            : (int) JavascriptNumber::GetValue(args.Values[1]));

        JavascriptArray *ret = nullptr;

        UErrorCode status = U_ZERO_ERROR;
        char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
        JavascriptString *langtag = UnsafeVarTo<JavascriptString>(args.Values[2]);
        LangtagToLocaleID(langtag, localeID);

        JavascriptLibrary *library = scriptContext->GetLibrary();
        PropertyOperationFlags flag = PropertyOperationFlags::PropertyOperation_None;

        if (kind == LocaleDataKind::Collation)
        {
            ScopedUEnumeration collations(ucol_getKeywordValuesForLocale("collation", localeID, false, &status));
            int collationsCount = uenum_count(collations, &status);

            // we expect collationsCount to have at least "standard" and "search" in it
            ICU_ASSERT(status, collationsCount > 2);

            // the return array can't include "standard" and "search", but must have its first element be null (count - 2 + 1) [#sec-intl-collator-internal-slots]
            ret = library->CreateArray(collationsCount - 1);
            ret->SetItem(0, library->GetNull(), flag);

            int collationLen = 0;
            const char *collation = nullptr;
            int i = 0;
            for (collation = uenum_next(collations, &collationLen, &status); collation != nullptr; collation = uenum_next(collations, &collationLen, &status))
            {
                ICU_ASSERT(status, collation != nullptr && collationLen > 0);
                if (strcmp(collation, "standard") == 0 || strcmp(collation, "search") == 0)
                {
                    // continue does not create holes in ret because i is set outside the loop
                    continue;
                }

                // OS#17172584: OOM during uloc_toUnicodeLocaleType can make this return nullptr even for known collations
                const char *unicodeCollation = ThrowOOMIfNull(uloc_toUnicodeLocaleType("collation", collation));
                const size_t unicodeCollationLen = strlen(unicodeCollation);

                // we only need strlen(unicodeCollation) + 1 char16s because unicodeCollation will always be ASCII (funnily enough)
                char16 *unicodeCollation16 = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, unicodeCollationLen + 1);
                charcount_t unicodeCollation16Len = 0;
                HRESULT hr = utf8::NarrowStringToWideNoAlloc(
                    unicodeCollation,
                    unicodeCollationLen,
                    unicodeCollation16,
                    unicodeCollationLen + 1,
                    &unicodeCollation16Len
                );
                AssertOrFailFastMsg(
                    hr == S_OK && unicodeCollation16Len == unicodeCollationLen && unicodeCollation16Len < MaxCharCount,
                    "Unicode collation char16 conversion was unsuccessful"
                );
                // i + 1 to not overwrite leading null element
                ret->SetItem(i + 1, JavascriptString::NewWithBuffer(
                    unicodeCollation16,
                    unicodeCollation16Len,
                    scriptContext
                ), PropertyOperationFlags::PropertyOperation_None);
                i++;
            }
        }
        else if (kind == LocaleDataKind::CaseFirst)
        {
            ScopedUCollator collator(ucol_open(localeID, &status));
            UColAttributeValue kf = ucol_getAttribute(collator, UCOL_CASE_FIRST, &status);
            ICU_ASSERT(status, true);
            ret = library->CreateArray(3);

            JavascriptString *falseStr = library->GetFalseDisplayString();
            JavascriptString *upperStr = library->GetIntlCaseFirstUpperString();
            JavascriptString *lowerStr = library->GetIntlCaseFirstLowerString();

            if (kf == UCOL_OFF)
            {
                ret->SetItem(0, falseStr, flag);
                ret->SetItem(1, upperStr, flag);
                ret->SetItem(2, lowerStr, flag);
            }
            else if (kf == UCOL_UPPER_FIRST)
            {
                ret->SetItem(0, upperStr, flag);
                ret->SetItem(1, lowerStr, flag);
                ret->SetItem(2, falseStr, flag);
            }
            else if (kf == UCOL_LOWER_FIRST)
            {
                ret->SetItem(0, lowerStr, flag);
                ret->SetItem(1, upperStr, flag);
                ret->SetItem(2, falseStr, flag);
            }
        }
        else if (kind == LocaleDataKind::Numeric)
        {
            ScopedUCollator collator(ucol_open(localeID, &status));
            UColAttributeValue kn = ucol_getAttribute(collator, UCOL_NUMERIC_COLLATION, &status);
            ICU_ASSERT(status, true);
            ret = library->CreateArray(2);

            JavascriptString *falseStr = library->GetFalseDisplayString();
            JavascriptString *trueStr = library->GetTrueDisplayString();

            if (kn == UCOL_OFF)
            {
                ret->SetItem(0, falseStr, flag);
                ret->SetItem(1, trueStr, flag);
            }
            else if (kn == UCOL_ON)
            {
                ret->SetItem(0, trueStr, flag);
                ret->SetItem(1, falseStr, flag);
            }
        }
        else if (kind == LocaleDataKind::Calendar)
        {
            ScopedUEnumeration calendars(ucal_getKeywordValuesForLocale("calendar", localeID, false, &status));
            ret = library->CreateArray(uenum_count(calendars, &status));
            ICU_ASSERT(status, true);

            int calendarLen = 0;
            const char *calendar = nullptr;
            int i = 0;
            for (calendar = uenum_next(calendars, &calendarLen, &status); calendar != nullptr; calendar = uenum_next(calendars, &calendarLen, &status))
            {
                ICU_ASSERT(status, calendar != nullptr && calendarLen > 0);

                // OS#17172584: OOM during uloc_toUnicodeLocaleType can make this return nullptr even for known calendars
                const char *unicodeCalendar = ThrowOOMIfNull(uloc_toUnicodeLocaleType("calendar", calendar));
                const size_t unicodeCalendarLen = strlen(unicodeCalendar);

                // we only need strlen(unicodeCalendar) + 1 char16s because unicodeCalendar will always be ASCII (funnily enough)
                char16 *unicodeCalendar16 = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, strlen(unicodeCalendar) + 1);
                charcount_t unicodeCalendar16Len = 0;
                HRESULT hr = utf8::NarrowStringToWideNoAlloc(
                    unicodeCalendar,
                    unicodeCalendarLen,
                    unicodeCalendar16,
                    unicodeCalendarLen + 1,
                    &unicodeCalendar16Len
                );
                AssertOrFailFastMsg(
                    hr == S_OK && unicodeCalendar16Len == unicodeCalendarLen && unicodeCalendar16Len < MaxCharCount,
                    "Unicode calendar char16 conversion was unsuccessful"
                );
                ret->SetItem(i, JavascriptString::NewWithBuffer(
                    unicodeCalendar16,
                    static_cast<charcount_t>(unicodeCalendar16Len),
                    scriptContext
                ), flag);
                i++;
            }
        }
        else if (kind == LocaleDataKind::NumberingSystem)
        {
            // unumsys_openAvailableNames has multiple bugs (http://bugs.icu-project.org/trac/ticket/11908) and also
            // does not provide a locale-specific set of numbering systems
            // the Intl spec provides a list of required numbering systems to support in #table-numbering-system-digits
            // For now, assume that all of those numbering systems are supported, and just get the default using unumsys_open
            // unumsys_open will also ensure that "native", "traditio", and "finance" are not returned, as per #sec-intl.datetimeformat-internal-slots
            ScopedUNumberingSystem numsys(unumsys_open(localeID, &status));
            ICU_ASSERT(status, true);
            utf8::NarrowToWide numsysName(unumsys_getName(numsys));

            // NOTE: update the initial array length if the list of available numbering systems changes in the future!
            ret = library->CreateArray(22);
            int i = 0;
            ret->SetItem(i++, JavascriptString::NewCopySz(numsysName, scriptContext), flag);

            // It doesn't matter that item 0 will be in the array twice (aside for size), because item 0 is the
            // preferred numbering system for the given locale, so it has precedence over everything else
            ret->SetItem(i++, library->GetIntlNumsysArabString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysArabextString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysBaliString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysBengString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysDevaString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysFullwideString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysGujrString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysGuruString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysHanidecString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysKhmrString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysKndaString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysLaooString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysLatnString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysLimbString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysMlymString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysMongString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysMymrString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysOryaString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysTamldecString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysTeluString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysThaiString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysTibtString(), flag);
        }
        else if (kind == LocaleDataKind::HourCycle)
        {
            // #sec-intl.datetimeformat-internal-slots: "[[LocaleData]][locale].hc must be < null, h11, h12, h23, h24 > for all locale values"
            ret = library->CreateArray(5);
            int i = 0;
            ret->SetItem(i++, library->GetNull(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle11String(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle12String(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle23String(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle24String(), flag);
        }
        else
        {
            AssertOrFailFastMsg(false, "GetLocaleData called with unknown kind parameter");
        }

        return ret;
#else
        AssertOrFailFastMsg(false, "Intl with Windows Globalization should never call GetLocaleData");
        return nullptr;
#endif
    }